

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void rt_add1col(int hx,int sx,int yl,int yh)

{
  lighttable_t *plVar1;
  DWORD *pDVar2;
  DWORD *pDVar3;
  BYTE *pBVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  
  pBVar4 = dc_temp;
  pDVar3 = dc_destblend;
  pDVar2 = dc_srcblend;
  plVar1 = dc_colormap;
  if (-1 < yh - yl) {
    pbVar6 = dc_destorg + (long)sx + (long)ylookup[yl];
    lVar7 = (long)dc_pitch;
    lVar8 = 0;
    do {
      uVar5 = pDVar3[*pbVar6] + pDVar2[plVar1[pBVar4[lVar8 * 4 + (long)(hx + yl * 4)]]] | 0x1f07c1f;
      *pbVar6 = RGB32k.All[uVar5 >> 0xf & uVar5];
      pbVar6 = pbVar6 + lVar7;
      lVar8 = lVar8 + 1;
    } while ((yh - yl) + 1 != (int)lVar8);
  }
  return;
}

Assistant:

void rt_add1col (int hx, int sx, int yl, int yh)
{
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4 + hx];
	pitch = dc_pitch;
	colormap = dc_colormap;

	do {
		DWORD fg = colormap[*source];
		DWORD bg = *dest;

		fg = fg2rgb[fg];
		bg = bg2rgb[bg];
		fg = (fg+bg) | 0x1f07c1f;
		*dest = RGB32k.All[fg & (fg>>15)];
		source += 4;
		dest += pitch;
	} while (--count);
}